

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BoxCoordinatesMode::SerializeWithCachedSizes
          (BoxCoordinatesMode *this,CodedOutputStream *output)

{
  if (this->boxmode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->boxmode_,output);
    return;
  }
  return;
}

Assistant:

void BoxCoordinatesMode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BoxCoordinatesMode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.BoxCoordinatesMode.Coordinates boxMode = 1;
  if (this->boxmode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->boxmode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BoxCoordinatesMode)
}